

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int stb_vorbis_seek_frame(stb_vorbis *f,uint sample_number)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint32 uVar6;
  uint32 uVar7;
  ulong uVar8;
  int iVar9;
  STBVorbisError SVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  uint end;
  ProbedPage left;
  uint local_78;
  uint local_74;
  int left_end;
  uint uStack_6c;
  uint local_68;
  int mode;
  double local_60;
  double local_58;
  ulong local_50;
  double local_48;
  ulong local_40;
  int right_end;
  
  uVar3 = stb_vorbis_stream_length_in_samples(f);
  if (uVar3 == 0) {
    SVar10 = VORBIS_seek_without_length;
  }
  else if (uVar3 < sample_number) {
    SVar10 = VORBIS_seek_invalid;
  }
  else {
    uVar3 = f->blocksize_1 - f->blocksize_0 >> 2;
    uVar13 = sample_number - uVar3;
    if (sample_number < uVar3) {
      uVar13 = 0;
    }
    left.last_decoded_sample = (f->p_first).last_decoded_sample;
    left.page_start = (f->p_first).page_start;
    left.page_end = (f->p_first).page_end;
    SVar10 = VORBIS_seek_failed;
    do {
      if (left.last_decoded_sample != 0xffffffff) {
        if (uVar13 <= left.last_decoded_sample) {
          iVar4 = stb_vorbis_seek_start(f);
          goto LAB_0011a649;
        }
        local_74 = (f->p_last).last_decoded_sample;
        uVar8 = (ulong)(f->p_last).page_start;
        local_48 = (double)uVar13;
        local_78 = (f->p_last).page_end;
        uVar12 = 0;
        local_58 = 0.0;
        local_60 = 0.0;
        uVar3 = local_78;
        goto LAB_0011a48e;
      }
      set_file_offset(f,left.page_end);
      iVar4 = get_seek_page_info(f,&left);
    } while (iVar4 != 0);
LAB_0011a42b:
    stb_vorbis_seek_start(f);
  }
  goto LAB_0011a433;
LAB_0011a48e:
  uVar11 = (int)uVar8 - left.page_end;
  if (uVar11 == 0) goto LAB_0011a782;
  local_50 = uVar12;
  local_40 = uVar8;
  if (uVar11 < 0x10001) {
    set_file_offset(f,left.page_end);
  }
  else {
    if ((uint)uVar12 < 2) {
      if ((uint)uVar12 == 0) {
        local_60 = (double)(local_78 - left.page_start) / (double)local_74;
        dVar14 = (double)(uVar13 - left.last_decoded_sample) * local_60 +
                 (double)(left._0_8_ & 0xffffffff);
      }
      else {
        dVar15 = (local_48 - (double)uVar3) * local_60;
        dVar14 = 8000.0;
        if (8000.0 <= dVar15) {
          dVar14 = dVar15;
        }
        dVar14 = (double)(~-(ulong)(0.0 <= dVar15) & (ulong)dVar15 |
                         (ulong)dVar14 & -(ulong)(0.0 <= dVar15));
        dVar15 = -8000.0;
        if (dVar14 <= -8000.0) {
          dVar15 = dVar14;
        }
        dVar14 = (double)(~-(ulong)(dVar14 < 0.0) & (ulong)dVar14 |
                         (ulong)dVar15 & -(ulong)(dVar14 < 0.0));
        dVar14 = dVar14 + dVar14 + local_58;
      }
      local_58 = (double)((int)uVar8 - 0x10000);
      dVar15 = (double)left.page_end;
      if ((double)left.page_end <= dVar14) {
        dVar15 = dVar14;
      }
      if (dVar15 <= local_58) {
        local_58 = dVar15;
      }
      uVar3 = (uint)(long)local_58;
    }
    else {
      uVar3 = (left.page_end + (uVar11 >> 1)) - 0x8000;
    }
    set_file_offset(f,uVar3);
    uVar7 = vorbis_find_page(f,(uint32 *)0x0,(uint32 *)0x0);
    if (uVar7 == 0) goto LAB_0011a42b;
  }
  while( true ) {
    iVar4 = get_seek_page_info(f,(ProbedPage *)&left_end);
    if (iVar4 == 0) goto LAB_0011a42b;
    if (local_68 != 0xffffffff) break;
    set_file_offset(f,uStack_6c);
  }
  uVar8 = local_40;
  if (left_end == (int)local_40) {
    if ((1 < (uint)local_50) || (uVar11 < 0x10001)) goto LAB_0011a782;
  }
  else if (uVar13 < local_68) {
    local_78 = uStack_6c;
    local_74 = local_68;
    uVar8 = (ulong)(uint)left_end;
  }
  else {
    left.last_decoded_sample = local_68;
    left.page_end = uStack_6c;
    left.page_start = left_end;
  }
  uVar12 = (ulong)((uint)local_50 + 1);
  uVar3 = local_68;
  goto LAB_0011a48e;
LAB_0011a782:
  uVar7 = left.page_start;
  set_file_offset(f,left.page_start);
  iVar4 = start_page(f);
  if (iVar4 != 0) {
    uVar3 = f->end_seg_with_known_loc;
    while( true ) {
      uVar8 = (ulong)uVar3;
      uVar13 = uVar3 + 1;
      while (0 < (int)uVar8) {
        uVar13 = uVar13 - 1;
        lVar2 = uVar8 - 1;
        uVar8 = uVar8 - 1;
        if (f->segments[lVar2] != 0xff) goto LAB_0011a868;
      }
      if ((f->page_flag & 1) == 0) break;
      if (uVar7 < 0x10000) {
        uVar3 = f->first_audio_page_offset;
      }
      else {
        uVar3 = f->first_audio_page_offset;
        if (f->first_audio_page_offset < uVar7 - 0x10000) {
          uVar3 = uVar7 - 0x10000;
        }
      }
      do {
        set_file_offset(f,uVar3);
        uVar6 = vorbis_find_page(f,&end,(uint32 *)0x0);
        if (uVar6 == 0) goto LAB_0011a42b;
        uVar3 = end;
      } while ((end < uVar7) ||
              (uVar13 = stb_vorbis_get_file_offset(f), uVar3 = end, uVar7 <= uVar13));
      uVar7 = stb_vorbis_get_file_offset(f);
      iVar4 = start_page(f);
      if (iVar4 == 0) goto LAB_0011a42b;
      uVar3 = f->segment_count - 1;
    }
    uVar13 = (int)uVar3 >> 0x1f & uVar3;
LAB_0011a868:
    f->current_loc_valid = 0;
    f->last_seg = 0;
    f->valid_bits = 0;
    f->packet_bytes = 0;
    f->bytes_in_seg = '\0';
    f->previous_length = 0;
    f->next_seg = uVar13;
    uVar12 = 0;
    uVar8 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar8 = uVar12;
    }
    for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      skip(f,(uint)f->segments[uVar12]);
    }
    iVar4 = vorbis_pump_first_frame(f);
LAB_0011a649:
    if (iVar4 == 0) {
      return 0;
    }
    uVar3 = f->current_loc;
    if (sample_number < uVar3) goto LAB_0011a433;
    iVar4 = f->blocksize_1;
    iVar1 = f->blocksize_0;
    while (uVar3 < sample_number) {
      iVar5 = vorbis_decode_initial(f,(int *)&left,&left_end,(int *)&end,&right_end,&mode);
      if (iVar5 == 0) goto LAB_0011a773;
      iVar5 = ilog(f->mode_count + -1);
      uVar3 = iVar5 + 8 + (uint)(f->mode_config[mode].blockflag != '\0') * 2;
      iVar5 = (int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) / 8;
      iVar9 = (int)(short)iVar5;
      f->bytes_in_seg = f->bytes_in_seg + (char)iVar5;
      f->packet_bytes = f->packet_bytes - iVar9;
      skip(f,-iVar9);
      iVar5 = f->next_seg;
      if (iVar5 == -1) {
        iVar5 = f->segment_count;
      }
      f->next_seg = iVar5 + -1;
      f->valid_bits = 0;
      uVar3 = (end - left.page_start) + f->current_loc;
      if (sample_number < uVar3) {
        return 1;
      }
      if (sample_number < uVar3 + (iVar4 * 3 - iVar1 >> 2)) {
        vorbis_pump_first_frame(f);
      }
      else {
        f->current_loc = uVar3;
        f->previous_length = 0;
        maybe_start_packet(f);
        flush_packet(f);
      }
      uVar3 = f->current_loc;
    }
    if (uVar3 == sample_number) {
      return 1;
    }
LAB_0011a773:
    f->error = VORBIS_seek_failed;
    return 0;
  }
LAB_0011a433:
  f->error = SVar10;
  return 0;
}

Assistant:

int stb_vorbis_seek_frame(stb_vorbis *f, unsigned int sample_number)
{
   uint32 max_frame_samples;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   // fast page-level search
   if (!seek_to_sample_coarse(f, sample_number))
      return 0;

   assert(f->current_loc_valid);
   assert(f->current_loc <= sample_number);

   // linear search for the relevant packet
   max_frame_samples = (f->blocksize_1*3 - f->blocksize_0) >> 2;
   while (f->current_loc < sample_number) {
      int left_start, left_end, right_start, right_end, mode, frame_samples;
      if (!peek_decode_initial(f, &left_start, &left_end, &right_start, &right_end, &mode))
         return error(f, VORBIS_seek_failed);
      // calculate the number of samples returned by the next frame
      frame_samples = right_start - left_start;
      if (f->current_loc + frame_samples > sample_number) {
         return 1; // the next frame will contain the sample
      } else if (f->current_loc + frame_samples + max_frame_samples > sample_number) {
         // there's a chance the frame after this could contain the sample
         vorbis_pump_first_frame(f);
      } else {
         // this frame is too early to be relevant
         f->current_loc += frame_samples;
         f->previous_length = 0;
         maybe_start_packet(f);
         flush_packet(f);
      }
   }
   // the next frame should start with the sample
   if (f->current_loc != sample_number) return error(f, VORBIS_seek_failed);
   return 1;
}